

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O3

void __thiscall psy::C::SemanticModelTester::case0300(SemanticModelTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SyntaxKind SVar2;
  int iVar3;
  TagDeclarationSymbol *this_00;
  TagType *pTVar4;
  Lexeme *pLVar5;
  undefined8 uVar6;
  ostream *poVar7;
  string local_70;
  undefined1 local_50 [16];
  size_type *local_40;
  size_type local_30 [2];
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"struct x { int _ ; } ;","");
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  compile<psy::C::StructOrUnionDeclarationSyntax>
            ((SemanticModelTester *)local_50,(string *)this,&local_70);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  SVar2 = SyntaxNode::kind((SyntaxNode *)local_50._8_8_);
  if (SVar2 == StructDeclaration) {
    this_00 = (TagDeclarationSymbol *)
              SemanticModel::structFor
                        ((SemanticModel *)local_50._0_8_,
                         (StructOrUnionDeclarationSyntax *)local_50._8_8_);
    if (this_00 != (TagDeclarationSymbol *)0x0) {
      pTVar4 = TagDeclarationSymbol::introducedNewType(this_00);
      pLVar5 = &TagType::tag(pTVar4)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_70,pLVar5);
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      pTVar4 = TagDeclarationSymbol::introducedNewType(this_00);
      pLVar5 = &TagType::tag(pTVar4)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_70,pLVar5);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\tExpected: ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x1ce);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::__cxx11::string::~string((string *)&local_70);
      goto LAB_003decfa;
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar7 = std::operator<<(poVar7,"\t\tExpression is NOT ");
    poVar7 = std::operator<<(poVar7,"true");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"\t\t");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    iVar3 = 0x1cd;
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
    SVar2 = SyntaxNode::kind((SyntaxNode *)local_50._8_8_);
    poVar7 = C::operator<<(poVar7,SVar2);
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
    poVar7 = C::operator<<(poVar7,StructDeclaration);
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"\t\t");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    iVar3 = 0x1cb;
  }
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar3);
  std::endl<char,std::char_traits<char>>(poVar7);
LAB_003decfa:
  uVar6 = __cxa_allocate_exception(1);
  __cxa_throw(uVar6,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0300()
{
    auto [tyDeclNode, semaModel] =
            compile<StructOrUnionDeclarationSyntax>("struct x { int _ ; } ;");

    PSY_EXPECT_EQ_ENU(tyDeclNode->kind(), SyntaxKind::StructDeclaration, SyntaxKind);
    const StructDeclarationSymbol* strukt = semaModel->structFor(tyDeclNode->asStructOrUnionDeclaration());
    PSY_EXPECT_TRUE(strukt);
    PSY_EXPECT_EQ_STR(strukt->introducedNewType()->tag()->valueText(), "x");
}